

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx_batch.c
# Opt level: O3

char * get_align_hyp(ps_decoder_t *ps,int *out_score)

{
  char *pcVar1;
  ps_seg_t *ppVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  int iVar6;
  
  pcVar1 = ps_get_hyp(ps,out_score);
  if (pcVar1 == (char *)0x0) {
    iVar6 = 0x291;
  }
  else {
    ppVar2 = ps_seg_iter(ps);
    if (ppVar2 != (ps_seg_t *)0x0) {
      iVar6 = 0;
      do {
        if (-1 < ppVar2->wid) {
          sVar3 = strlen(ppVar2->text);
          iVar6 = iVar6 + (int)sVar3 + 1;
        }
        ppVar2 = ps_seg_next(ppVar2);
      } while (ppVar2 != (ps_seg_t *)0x0);
      if (iVar6 != 0) {
        pcVar4 = (char *)__ckd_malloc__((long)iVar6,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                                        ,0x29c);
        ppVar2 = ps_seg_iter(ps);
        pcVar1 = pcVar4;
        for (; ppVar2 != (ps_seg_t *)0x0; ppVar2 = ps_seg_next(ppVar2)) {
          if (-1 < ppVar2->wid) {
            pcVar5 = ppVar2->text;
            sVar3 = strlen(pcVar5);
            memcpy(pcVar1,pcVar5,(long)(int)sVar3);
            pcVar5 = pcVar1 + (int)sVar3;
            pcVar1 = pcVar5 + 1;
            *pcVar5 = ' ';
          }
        }
        pcVar1[-1] = '\0';
        return pcVar4;
      }
    }
    iVar6 = 0x29b;
  }
  pcVar1 = __ckd_salloc__("",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/programs/pocketsphinx_batch.c"
                          ,iVar6);
  return pcVar1;
}

Assistant:

static char *
get_align_hyp(ps_decoder_t *ps, int *out_score)
{
    ps_seg_t *itor;
    char *out, *ptr;
    int len;
    
    if (ps_get_hyp(ps, out_score) == NULL)
        return ckd_salloc("");
    len = 0;
    for (itor = ps_seg_iter(ps); itor; itor = ps_seg_next(itor)) {
        /* FIXME: Need to handle tag transitions somehow... */
        if (itor->wid < 0)
            continue;
        len += strlen(itor->text);
        len++;
    }
    if (len == 0)
        return ckd_salloc("");
    ptr = out = ckd_malloc(len);
    for (itor = ps_seg_iter(ps); itor; itor = ps_seg_next(itor)) {
        if (itor->wid < 0)
            continue;
        len = strlen(itor->text);
        memcpy(ptr, itor->text, len);
        ptr += len;
        *ptr++ = ' ';
    }
    *--ptr = '\0';
    return out;
}